

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

int phosg::rename(char *__old,char *__new)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = ::rename(*(char **)__old,*(char **)__new);
  if (iVar1 == 0) {
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_c8,"can\'t rename file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__old);
  pbVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_c8," to ");
  local_a8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == paVar4) {
    local_a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_a8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  ::std::operator+(&local_68,&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__new);
  pbVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68
                      ,": ");
  local_e8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p == paVar4) {
    local_e8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_e8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  puVar3 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_88,(phosg *)(ulong)*puVar3,error);
  ::std::operator+(&local_48,&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
  ::std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void rename(const std::string& old_filename, const std::string& new_filename) {
  if (::rename(old_filename.c_str(), new_filename.c_str()) != 0) {
    throw runtime_error("can\'t rename file " + old_filename + " to " + new_filename + ": " + string_for_error(errno));
  }
}